

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

string * __thiscall
vkt::QueryPool::(anonymous_namespace)::outputTypeToGLString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          VkPrimitiveTopology *outputType)

{
  int iVar1;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  _anonymous_namespace_ *local_18;
  VkPrimitiveTopology *outputType_local;
  
  iVar1 = *(int *)this;
  local_18 = this;
  outputType_local = (VkPrimitiveTopology *)__return_storage_ptr__;
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"points",&local_19);
    std::allocator<char>::~allocator(&local_19);
    return __return_storage_ptr__;
  }
  if (iVar1 - 1U < 2) {
LAB_00cb9073:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"line_strip",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else {
    if (2 < iVar1 - 3U) {
      if (iVar1 - 6U < 2) goto LAB_00cb9073;
      if (1 < iVar1 - 8U) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"error",&local_2f);
        std::allocator<char>::~allocator(&local_2f);
        return __return_storage_ptr__;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"triangle_strip",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string outputTypeToGLString (const VkPrimitiveTopology& outputType)
{
	switch (outputType)
	{
		case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
			return "points";
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
				return "line_strip";
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			return "triangle_strip";
		default:
			DE_ASSERT(DE_FALSE);
			return "error";
	}
}